

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalNinjaGenerator::WriteTargetCleanAdditional(cmGlobalNinjaGenerator *this,ostream *os)

{
  reference pbVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  pointer pcVar6;
  string *psVar7;
  reference this_00;
  pointer this_01;
  ostream *poVar8;
  pointer ppVar9;
  cmMakefile *this_02;
  type os_00;
  char *pcVar10;
  reference pvVar11;
  mapped_type *pmVar12;
  undefined8 in_R8;
  undefined1 auVar13 [16];
  string_view sVar14;
  byte local_861;
  byte local_841;
  allocator<char> local_811;
  key_type local_810;
  allocator<char> local_7e9;
  string local_7e8;
  string local_7c8;
  allocator<char> local_7a1;
  key_type local_7a0;
  allocator<char> local_779;
  string local_778;
  string local_758;
  string local_738 [32];
  reference local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string local_6f0;
  undefined1 local_6d0 [8];
  cmNinjaBuild build;
  string local_580;
  string local_560;
  string local_540;
  allocator<char> local_519;
  string local_518;
  undefined1 local_4f8 [8];
  cmNinjaRule rule;
  string local_3c0;
  string *local_3a0;
  string *acf;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  _Self local_378;
  iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  cmGeneratedFileStream fout;
  _Self local_d8;
  _Self local_d0;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_a0 [7];
  bool empty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  undefined1 local_80 [8];
  string cleanScriptAbs;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string cleanScriptRel;
  value_type *lgr;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  cleanScriptRel.field_2._8_8_ =
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::at(&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"CMakeFiles/clean_additional.cmake",&local_49);
  std::allocator<char>::~allocator(&local_49);
  pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                      cleanScriptRel.field_2._8_8_);
  psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar6);
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
            ((string *)local_80,psVar7,
             (char *)((long)&configs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  this_00 = std::
            vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
            ::operator[](&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,0)
  ;
  this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_00);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a0,this_01,IncludeEmptyConfig);
  bVar4 = true;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a0);
  config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a0);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&config);
    if (!bVar2) {
LAB_0041e3b3:
      if (bVar4) {
        cmsys::SystemTools::RemoveFile((string *)local_80);
        this_local._7_1_ = 0;
        fout._612_4_ = 1;
      }
      else {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&__range1_1,(string *)local_80,false,None);
        bVar3 = std::ios::operator!((ios *)((long)&__range1_1 +
                                           (long)__range1_1[-1].
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
        if ((bVar3 & 1) == 0) {
          std::operator<<((ostream *)&__range1_1,
                          "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n");
          __end1_1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_a0);
          config_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a0);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end1_1,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&config_1), bVar4) {
            it_1._M_node = (_Base_ptr)
                           __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&__end1_1);
            local_378._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                 ::find(&this->Configs,(key_type *)it_1._M_node);
            __range3 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                          ::end(&this->Configs);
            bVar4 = std::operator!=(&local_378,(_Self *)&__range3);
            local_861 = 0;
            if (bVar4) {
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>
                       ::operator->(&local_378);
              bVar4 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty(&(ppVar9->second).AdditionalCleanFiles);
              local_861 = bVar4 ^ 0xff;
            }
            if ((local_861 & 1) != 0) {
              poVar8 = std::operator<<((ostream *)&__range1_1,
                                       "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
                                      );
              poVar8 = std::operator<<(poVar8,(string *)it_1._M_node);
              std::operator<<(poVar8,"\")\n");
              std::operator<<((ostream *)&__range1_1,"  file(REMOVE_RECURSE\n");
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>
                       ::operator->(&local_378);
              __end3 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&(ppVar9->second).AdditionalCleanFiles);
              acf = (string *)
                    std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(&(ppVar9->second).AdditionalCleanFiles);
              while (bVar4 = std::operator!=(&__end3,(_Self *)&acf), bVar4) {
                local_3a0 = std::
                            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&__end3);
                poVar8 = std::operator<<((ostream *)&__range1_1,"  ");
                psVar7 = ConvertToNinjaPath(this,local_3a0);
                auVar13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7)
                ;
                sVar14._M_len = auVar13._8_8_;
                rule._288_8_ = auVar13._0_8_;
                sVar14._M_str = (char *)0x0;
                cmOutputConverter::EscapeForCMake_abi_cxx11_
                          (&local_3c0,(cmOutputConverter *)rule._288_8_,sVar14,(WrapQuotes)in_R8);
                poVar8 = std::operator<<(poVar8,(string *)&local_3c0);
                std::operator<<(poVar8,'\n');
                std::__cxx11::string::~string((string *)&local_3c0);
                std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&__end3);
              }
              std::operator<<((ostream *)&__range1_1,"  )\n");
              std::operator<<((ostream *)&__range1_1,"endif()\n");
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end1_1);
          }
          fout._612_4_ = 0;
        }
        else {
          this_local._7_1_ = 0;
          fout._612_4_ = 1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range1_1);
        if (fout._612_4_ == 0) {
          pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                   operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                               *)cleanScriptRel.field_2._8_8_);
          this_02 = cmLocalGenerator::GetMakefile(pcVar6);
          cmMakefile::AddCMakeOutputFile(this_02,(string *)local_80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_518,"CLEAN_ADDITIONAL",&local_519);
          cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_4f8,&local_518);
          std::__cxx11::string::~string((string *)&local_518);
          std::allocator<char>::~allocator(&local_519);
          CMakeCmd_abi_cxx11_(&local_560,this);
          pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                   operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                               *)cleanScriptRel.field_2._8_8_);
          NinjaOutputPath((string *)((long)&build.RspFile.field_2 + 8),this,(string *)local_48);
          sVar14 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)(build.RspFile.field_2._M_local_buf + 8));
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_580,&pcVar6->super_cmOutputConverter,sVar14,SHELL,false);
          cmStrCat<std::__cxx11::string,char_const(&)[22],std::__cxx11::string>
                    (&local_540,&local_560,(char (*) [22])" -DCONFIG=$CONFIG -P ",&local_580);
          std::__cxx11::string::operator=
                    ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_540);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_580);
          std::__cxx11::string::~string((string *)(build.RspFile.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_560);
          std::__cxx11::string::operator=
                    ((string *)(rule.Command.field_2._M_local_buf + 8),
                     "Cleaning additional files...");
          std::__cxx11::string::operator=
                    ((string *)(rule.Description.field_2._M_local_buf + 8),
                     "Rule for cleaning additional files.");
          os_00 = std::
                  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
                  operator*(&this->RulesFileStream);
          WriteRule((ostream *)os_00,(cmNinjaRule *)local_4f8);
          cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_4f8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f0,"CLEAN_ADDITIONAL",
                     (allocator<char> *)((long)&__range1_2 + 7));
          cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_6d0,&local_6f0);
          std::__cxx11::string::~string((string *)&local_6f0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
          std::__cxx11::string::operator=((string *)local_6d0,"Clean additional files.");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&build.Rule.field_2 + 8));
          __end1_2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_a0);
          config_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a0);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end1_2,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&config_2), bVar4) {
            local_718 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end1_2);
            pcVar10 = GetAdditionalCleanTargetName(this);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_778,pcVar10,&local_779);
            NinjaOutputPath(&local_758,this,&local_778);
            (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x4c])(local_738,this,&local_758);
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&build.Rule.field_2 + 8));
            std::__cxx11::string::operator=((string *)pvVar11,local_738);
            std::__cxx11::string::~string(local_738);
            std::__cxx11::string::~string((string *)&local_758);
            std::__cxx11::string::~string((string *)&local_778);
            std::allocator<char>::~allocator(&local_779);
            pbVar1 = local_718;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7a0,"CONFIG",&local_7a1);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&build.OrderOnlyDeps.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_7a0
                                  );
            std::__cxx11::string::operator=((string *)pmVar12,(string *)pbVar1);
            std::__cxx11::string::~string((string *)&local_7a0);
            std::allocator<char>::~allocator(&local_7a1);
            WriteBuild(this,os,(cmNinjaBuild *)local_6d0,0,(bool *)0x0);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end1_2);
          }
          uVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x28])();
          if ((uVar5 & 1) != 0) {
            pcVar10 = GetAdditionalCleanTargetName(this);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7e8,pcVar10,&local_7e9);
            NinjaOutputPath(&local_7c8,this,&local_7e8);
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&build.Rule.field_2 + 8));
            std::__cxx11::string::operator=((string *)pvVar11,(string *)&local_7c8);
            std::__cxx11::string::~string((string *)&local_7c8);
            std::__cxx11::string::~string((string *)&local_7e8);
            std::allocator<char>::~allocator(&local_7e9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_810,"CONFIG",&local_811);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&build.OrderOnlyDeps.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_810
                                  );
            std::__cxx11::string::operator=((string *)pmVar12,"");
            std::__cxx11::string::~string((string *)&local_810);
            std::allocator<char>::~allocator(&local_811);
            WriteBuild(this,os,(cmNinjaBuild *)local_6d0,0,(bool *)0x0);
          }
          cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_6d0);
          this_local._7_1_ = 1;
          fout._612_4_ = 1;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a0);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)local_48);
      return (bool)(this_local._7_1_ & 1);
    }
    it._M_node = (_Base_ptr)
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
         ::find(&this->Configs,(key_type *)it._M_node);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
         ::end(&this->Configs);
    bVar2 = std::operator!=(&local_d0,&local_d8);
    local_841 = 0;
    if (bVar2) {
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>
               ::operator->(&local_d0);
      bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&(ppVar9->second).AdditionalCleanFiles);
      local_841 = bVar2 ^ 0xff;
    }
    if ((local_841 & 1) != 0) {
      bVar4 = false;
      goto LAB_0041e3b3;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmGlobalNinjaGenerator::WriteTargetCleanAdditional(std::ostream& os)
{
  const auto& lgr = this->LocalGenerators.at(0);
  std::string cleanScriptRel = "CMakeFiles/clean_additional.cmake";
  std::string cleanScriptAbs =
    cmStrCat(lgr->GetBinaryDirectory(), '/', cleanScriptRel);
  std::vector<std::string> configs =
    this->Makefiles[0]->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Check if there are additional files to clean
  bool empty = true;
  for (auto const& config : configs) {
    auto const it = this->Configs.find(config);
    if (it != this->Configs.end() &&
        !it->second.AdditionalCleanFiles.empty()) {
      empty = false;
      break;
    }
  }
  if (empty) {
    // Remove cmake clean script file if it exists
    cmSystemTools::RemoveFile(cleanScriptAbs);
    return false;
  }

  // Write cmake clean script file
  {
    cmGeneratedFileStream fout(cleanScriptAbs);
    if (!fout) {
      return false;
    }
    fout << "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n";
    for (auto const& config : configs) {
      auto const it = this->Configs.find(config);
      if (it != this->Configs.end() &&
          !it->second.AdditionalCleanFiles.empty()) {
        fout << "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
             << config << "\")\n";
        fout << "  file(REMOVE_RECURSE\n";
        for (std::string const& acf : it->second.AdditionalCleanFiles) {
          fout << "  "
               << cmOutputConverter::EscapeForCMake(
                    this->ConvertToNinjaPath(acf))
               << '\n';
        }
        fout << "  )\n";
        fout << "endif()\n";
      }
    }
  }
  // Register clean script file
  lgr->GetMakefile()->AddCMakeOutputFile(cleanScriptAbs);

  // Write rule
  {
    cmNinjaRule rule("CLEAN_ADDITIONAL");
    rule.Command = cmStrCat(
      this->CMakeCmd(), " -DCONFIG=$CONFIG -P ",
      lgr->ConvertToOutputFormat(this->NinjaOutputPath(cleanScriptRel),
                                 cmOutputConverter::SHELL));
    rule.Description = "Cleaning additional files...";
    rule.Comment = "Rule for cleaning additional files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN_ADDITIONAL");
    build.Comment = "Clean additional files.";
    build.Outputs.emplace_back();
    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName()), config);
      build.Variables["CONFIG"] = config;
      this->WriteBuild(os, build);
    }
    if (this->IsMultiConfig()) {
      build.Outputs.front() =
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName());
      build.Variables["CONFIG"] = "";
      this->WriteBuild(os, build);
    }
  }
  // Return success
  return true;
}